

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int send_request(http_t *info)

{
  int __fd;
  size_t __n;
  ssize_t sVar1;
  int len;
  http_t *info_local;
  
  memset(info->buffer,0,0x2000);
  snprintf(info->buffer,0x1fff,
           "GET %s HTTP/1.1\r\nAccept: */*\r\nUser-Agent: Mozilla/5.0 (compatible; MSIE 5.01; Windows NT 5.0)\r\nHost: %s\r\nConnection: Close\r\n\r\n"
           ,info->url,info->host_name);
  if ((print_level & 1U) != 0) {
    printf("[%s][%s(%d)]:request:\n%s\n","MSG_DEBUG","send_request",0xe4,info->buffer);
  }
  __fd = info->sock;
  __n = strlen(info->buffer);
  sVar1 = send(__fd,info->buffer,__n,0);
  return (int)sVar1;
}

Assistant:

int send_request(http_t *info) {
  int len;

  memset(info->buffer, 0x0, RECV_BUF);
  snprintf(info->buffer, RECV_BUF - 1,
           "GET %s HTTP/1.1\r\n"
           "Accept: */*\r\n"
           "User-Agent: Mozilla/5.0 (compatible; MSIE 5.01; Windows NT 5.0)\r\n"
           "Host: %s\r\n"
           "Connection: Close\r\n\r\n",
           info->url, info->host_name);

  lprintf(MSG_DEBUG, "request:\n%s\n", info->buffer);
  return send(info->sock, info->buffer, strlen(info->buffer), 0);
}